

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

QRegularExpression
QRegularExpression::fromWildcard
          (QStringView pattern,CaseSensitivity cs,WildcardConversionOptions options)

{
  PatternOptions options_00;
  undefined4 in_register_00000014;
  WildcardConversionOptions in_R8D;
  long in_FS_OFFSET;
  QStringView pattern_00;
  QString local_38;
  long local_20;
  
  pattern_00.m_size._4_4_ = in_register_00000014;
  pattern_00.m_size._0_4_ = cs;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pattern_00.m_data._0_4_ =
       in_R8D.super_QFlagsStorageHelper<QRegularExpression::WildcardConversionOption,_4>.
       super_QFlagsStorage<QRegularExpression::WildcardConversionOption>.i;
  pattern_00.m_data._4_4_ = 0;
  wildcardToRegularExpression(&local_38,(QRegularExpression *)pattern.m_data,pattern_00,in_R8D);
  options_00.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
  super_QFlagsStorage<QRegularExpression::PatternOption>.i._1_3_ = 0;
  options_00.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
  super_QFlagsStorage<QRegularExpression::PatternOption>.i._0_1_ =
       (QFlagsStorage<QRegularExpression::WildcardConversionOption>)
       options.super_QFlagsStorageHelper<QRegularExpression::WildcardConversionOption,_4>.
       super_QFlagsStorage<QRegularExpression::WildcardConversionOption>.i !=
       (QFlagsStorage<QRegularExpression::WildcardConversionOption>)0x1;
  QRegularExpression((QRegularExpression *)pattern.m_size,&local_38,options_00);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)pattern.m_size;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpression QRegularExpression::fromWildcard(QStringView pattern, Qt::CaseSensitivity cs,
                                                    WildcardConversionOptions options)
{
    auto reOptions = cs == Qt::CaseSensitive ? QRegularExpression::NoPatternOption :
                                             QRegularExpression::CaseInsensitiveOption;
    return QRegularExpression(wildcardToRegularExpression(pattern, options), reOptions);
}